

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MruDictionary.h
# Opt level: O1

bool __thiscall
JsUtil::
MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>
::TryGetValue(MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>
              *this,RegexKey *key,RegexPattern **value)

{
  MruListEntry *element;
  uint index;
  RegexPattern **ppRVar1;
  RegexKey *key_00;
  MruDictionaryData *this_00;
  
  index = BaseDictionary<UnifiedRegex::RegexKey,_JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::FindEntryWithKey<UnifiedRegex::RegexKey>(&this->dictionary,key);
  if (-1 < (int)index) {
    this_00 = (MruDictionaryData *)((this->dictionary).entries.ptr + index);
    element = (this_00->entry).ptr;
    if (element == (MruListEntry *)0x0) {
      ppRVar1 = MruDictionaryData::Value(this_00);
      *value = *ppRVar1;
      key_00 = BaseDictionary<UnifiedRegex::RegexKey,_JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               ::GetKeyAt(&this->dictionary,index);
      ppRVar1 = MruDictionaryData::Value(this_00);
      ReuseLeastRecentlyUsedEntry(this,key_00,ppRVar1,index);
    }
    else {
      DoublyLinkedListElement<JsUtil::MruDictionary<UnifiedRegex::RegexKey,UnifiedRegex::RegexPattern*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry>::MruListEntry,Memory::Recycler>
      ::
      MoveToBeginning<JsUtil::MruDictionary<UnifiedRegex::RegexKey,UnifiedRegex::RegexPattern*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry>::MruListEntry>
                (element,&(this->entries).head,&(this->entries).tail);
      *value = (element->value).ptr;
    }
  }
  return -1 < (int)index;
}

Assistant:

bool TryGetValue(const TKey &key, TValue *const value)
        {
            MruDictionaryData *dictionaryData;
            int dictionaryDataIndex;
            if(!dictionary.TryGetReference(key, &dictionaryData, &dictionaryDataIndex))
                return false;

            const auto entry = dictionaryData->Entry();
            if(entry)
            {
                // Make this the most recently used entry
                entries.MoveToBeginning(entry);
                *value = entry->value;
                return true;
            }

            *value = dictionaryData->Value();

            // The key passed into this function may be temporary, and should not be placed in the MRU list or dictionary. Get
            // the proper key to be used from the dictionary. That key should have the necessary lifetime.
            ReuseLeastRecentlyUsedEntry(dictionary.GetKeyAt(dictionaryDataIndex), dictionaryData->Value(), dictionaryDataIndex);

            return true;
        }